

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O1

int __thiscall CTPNAddrBase::is_addr_eq(CTPNAddrBase *this,CTPNAddr *node,int *comparable)

{
  CTcPrsNode *pCVar1;
  CTcPrsNode *pCVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  
  iVar3 = (*(((this->super_CTPNUnary).super_CTPNUnaryBase.sub_)->super_CTcPrsNodeBase).
            _vptr_CTcPrsNodeBase[0xc])();
  if ((CONCAT44(extraout_var,iVar3) != 0) &&
     (iVar3 = (*(((node->super_CTPNAddrBase).super_CTPNUnary.super_CTPNUnaryBase.sub_)->
                super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[0xc])(),
     CONCAT44(extraout_var_00,iVar3) != 0)) {
    *comparable = 1;
    pCVar1 = (this->super_CTPNUnary).super_CTPNUnaryBase.sub_;
    pCVar2 = (node->super_CTPNAddrBase).super_CTPNUnary.super_CTPNUnaryBase.sub_;
    iVar3 = (*(pCVar1->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[0xd])(pCVar1);
    iVar4 = (*(pCVar2->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[0xd])(pCVar2);
    if (CONCAT44(extraout_var_01,iVar3) != CONCAT44(extraout_var_02,iVar4)) {
      return 0;
    }
    iVar3 = (*(pCVar1->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[0xc])(pCVar1);
    iVar4 = (*(pCVar2->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[0xc])(pCVar2);
    iVar5 = (*(pCVar1->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[0xd])(pCVar1);
    iVar3 = bcmp((void *)CONCAT44(extraout_var_03,iVar3),(void *)CONCAT44(extraout_var_04,iVar4),
                 CONCAT44(extraout_var_05,iVar5));
    return (uint)(iVar3 == 0);
  }
  *comparable = 0;
  return 0;
}

Assistant:

int CTPNAddrBase::is_addr_eq(const CTPNAddr *node, int *comparable) const
{
    /* 
     *   If both sides are symbols, the addresses are equal if and only if
     *   the symbols are identical.  One symbol has exactly one meaning in
     *   a given context, and no two symbols can have the same meaning.
     *   (It's important that we be able to state this for all symbols,
     *   because we can't necessarily know during parsing the meaning of a
     *   given symbol, since the symbol could be a forward reference.)  
     */
    if (get_sub_expr()->get_sym_text() != 0
        && node->get_sub_expr()->get_sym_text() != 0)
    {
        CTcPrsNode *sym1;
        CTcPrsNode *sym2;

        /* they're both symbols, so they're comparable */
        *comparable = TRUE;

        /* they're the same if both symbols have the same text */
        sym1 = get_sub_expr();
        sym2 = node->get_sub_expr();
        return (sym1->get_sym_text_len() == sym2->get_sym_text_len()
                && memcmp(sym1->get_sym_text(), sym2->get_sym_text(),
                          sym1->get_sym_text_len()) == 0);
    }

    /* they're not comparable */
    *comparable = FALSE;
    return FALSE;
}